

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet.cpp
# Opt level: O0

JsonnetVm * jsonnet_make(void)

{
  JsonnetVm *pJVar1;
  bad_alloc *anon_var_0;
  exception *e;
  JsonnetVm *in_stack_000000f0;
  
  pJVar1 = (JsonnetVm *)operator_new(0xf0);
  JsonnetVm::JsonnetVm(in_stack_000000f0);
  return pJVar1;
}

Assistant:

JsonnetVm *jsonnet_make(void)
{
    TRY
        return new JsonnetVm();
    CATCH("jsonnet_make")
    return nullptr;
}